

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O1

void __thiscall
YAML::SingleDocParser::HandleDocument(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  Token *pTVar2;
  
  pTVar2 = Scanner::peek(this->m_scanner);
  (*eventHandler->_vptr_EventHandler[2])(eventHandler,&pTVar2->mark);
  pTVar2 = Scanner::peek(this->m_scanner);
  if (pTVar2->type == DOC_START) {
    Scanner::pop(this->m_scanner);
  }
  HandleNode(this,eventHandler);
  (*eventHandler->_vptr_EventHandler[3])(eventHandler);
  while( true ) {
    bVar1 = Scanner::empty(this->m_scanner);
    if (bVar1) {
      return;
    }
    pTVar2 = Scanner::peek(this->m_scanner);
    if (pTVar2->type != DOC_END) break;
    Scanner::pop(this->m_scanner);
  }
  return;
}

Assistant:

void SingleDocParser::HandleDocument(EventHandler& eventHandler) {
  assert(!m_scanner.empty());  // guaranteed that there are tokens
  assert(!m_curAnchor);

  eventHandler.OnDocumentStart(m_scanner.peek().mark);

  // eat doc start
  if (m_scanner.peek().type == Token::DOC_START)
    m_scanner.pop();

  // recurse!
  HandleNode(eventHandler);

  eventHandler.OnDocumentEnd();

  // and finally eat any doc ends we see
  while (!m_scanner.empty() && m_scanner.peek().type == Token::DOC_END)
    m_scanner.pop();
}